

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

void VulkanUtilities::BeginCmdQueueLabelRegion(VkQueue cmdQueue,char *pLabelName,float *color)

{
  int i;
  long lVar1;
  VkDebugUtilsLabelEXT Label;
  undefined8 local_28;
  undefined8 uStack_20;
  char *local_18;
  float afStack_10 [4];
  
  if ((anonymous_namespace)::QueueBeginDebugUtilsLabelEXT != (code *)0x0) {
    uStack_20 = 0;
    afStack_10[2] = 0.0;
    afStack_10[3] = 0.0;
    afStack_10[0] = 0.0;
    afStack_10[1] = 0.0;
    local_28 = 0x3b9cbe02;
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      afStack_10[lVar1] = color[lVar1];
    }
    local_18 = pLabelName;
    (*(anonymous_namespace)::QueueBeginDebugUtilsLabelEXT)(cmdQueue,&local_28);
  }
  return;
}

Assistant:

void BeginCmdQueueLabelRegion(VkQueue cmdQueue, const char* pLabelName, const float* color)
{
    if (QueueBeginDebugUtilsLabelEXT == nullptr)
        return;

    VkDebugUtilsLabelEXT Label{};
    Label.sType      = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
    Label.pNext      = nullptr;
    Label.pLabelName = pLabelName;
    for (int i = 0; i < 4; ++i)
        Label.color[i] = color[i];
    QueueBeginDebugUtilsLabelEXT(cmdQueue, &Label);
}